

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *this_00;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  reference pbVar6;
  vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *this_01;
  reference ppcVar7;
  allocator<char> local_639;
  string local_638;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  char *local_588;
  char *labels;
  string local_578;
  char *local_558;
  char *directoryLabels;
  string local_530;
  cmStateDirectory local_510;
  undefined1 local_4e8 [8];
  string outP;
  cmStateSnapshot *i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vec_t *__range1_1;
  string parentBinDir;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_470;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *local_458;
  vec_t *children;
  cmTestGenerator *tester;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *__range1;
  vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *testers;
  string *i;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_400;
  undefined1 local_3e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includesList;
  string local_3c0;
  char *local_3a0;
  char *testIncludeFiles;
  string local_390;
  char *local_370;
  char *testIncludeFile;
  cmStateDirectory local_340;
  undefined1 local_318 [8];
  cmGeneratedFileStream fout;
  undefined1 local_a8 [8];
  string file;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  allocator<char> local_31;
  string local_30;
  cmLocalGenerator *local_10;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_TESTING_ENABLED",&local_31);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config);
    cmMakefile::GetConfigurations
              ((string *)((long)&file.field_2 + 8),this->Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config,false);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&fout.field_0x240,&this->StateSnapshot);
    psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&fout.field_0x240);
    std::__cxx11::string::string((string *)local_a8,(string *)psVar3);
    std::__cxx11::string::operator+=((string *)local_a8,"/");
    std::__cxx11::string::operator+=((string *)local_a8,"CTestTestfile.cmake");
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_318,(string *)local_a8,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_318,true);
    poVar4 = std::operator<<((ostream *)local_318,"# CMake generated Testfile for ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# Source directory: ");
    cmStateSnapshot::GetDirectory(&local_340,&this->StateSnapshot);
    psVar3 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_340);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# Build directory: ");
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&testIncludeFile,&this->StateSnapshot);
    psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&testIncludeFile);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# This file includes the relevant testing commands ");
    poVar4 = std::operator<<(poVar4,"required for ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# testing this directory and lists subdirectories to ");
    poVar4 = std::operator<<(poVar4,"be tested as well.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"TEST_INCLUDE_FILE",
               (allocator<char> *)((long)&testIncludeFiles + 7));
    pcVar5 = cmMakefile::GetProperty(pcVar1,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testIncludeFiles + 7));
    local_370 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)local_318,"include(\"");
      poVar4 = std::operator<<(poVar4,local_370);
      poVar4 = std::operator<<(poVar4,"\")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"TEST_INCLUDE_FILES",
               (allocator<char> *)
               ((long)&includesList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar5 = cmMakefile::GetProperty(pcVar1,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&includesList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_3a0 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3e0);
      pcVar5 = local_3a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_400,pcVar5,(allocator<char> *)((long)&__range2 + 7));
      cmSystemTools::ExpandListArgument
                (&local_400,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3e0,false);
      std::__cxx11::string::~string((string *)&local_400);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3e0);
      i = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3e0);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&i), bVar2) {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        poVar4 = std::operator<<((ostream *)local_318,"include(\"");
        poVar4 = std::operator<<(poVar4,(string *)pbVar6);
        poVar4 = std::operator<<(poVar4,"\")");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3e0);
    }
    this_01 = cmMakefile::GetTestGenerators(this->Makefile);
    __end1 = std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::begin(this_01);
    tester = (cmTestGenerator *)
             std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                                       *)&tester), bVar2) {
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                ::operator*(&__end1);
      children = (vec_t *)*ppcVar7;
      cmTestGenerator::Compute((cmTestGenerator *)children,this);
      cmScriptGenerator::Generate
                ((cmScriptGenerator *)children,(ostream *)local_318,
                 (string *)((long)&file.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      __gnu_cxx::
      __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
      ::operator++(&__end1);
    }
    cmMakefile::GetStateSnapshot
              ((cmStateSnapshot *)((long)&parentBinDir.field_2 + 8),this->Makefile);
    cmStateSnapshot::GetChildren(&local_470,(cmStateSnapshot *)((long)&parentBinDir.field_2 + 8));
    local_458 = &local_470;
    psVar3 = GetCurrentBinaryDirectory_abi_cxx11_(this);
    std::__cxx11::string::string((string *)&__range1_1,(string *)psVar3);
    this_00 = local_458;
    __end1_1 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(local_458);
    i_1 = (cmStateSnapshot *)
          std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                               *)&i_1), bVar2) {
      outP.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
           ::operator*(&__end1_1);
      cmStateSnapshot::GetDirectory(&local_510,(cmStateSnapshot *)outP.field_2._8_8_);
      psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_510);
      std::__cxx11::string::string((string *)local_4e8,(string *)psVar3);
      MaybeConvertToRelativePath(&local_530,this,(string *)&__range1_1,(string *)local_4e8);
      std::__cxx11::string::operator=((string *)local_4e8,(string *)&local_530);
      std::__cxx11::string::~string((string *)&local_530);
      cmOutputConverter::EscapeForCMake((string *)&directoryLabels,(string *)local_4e8);
      std::__cxx11::string::operator=((string *)local_4e8,(string *)&directoryLabels);
      std::__cxx11::string::~string((string *)&directoryLabels);
      poVar4 = std::operator<<((ostream *)local_318,"subdirs(");
      poVar4 = std::operator<<(poVar4,(string *)local_4e8);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_4e8);
      __gnu_cxx::
      __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
      ::operator++(&__end1_1);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_578,"CMAKE_DIRECTORY_LABELS",(allocator<char> *)((long)&labels + 7))
    ;
    pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)((long)&labels + 7));
    pcVar1 = this->Makefile;
    local_558 = pcVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"LABELS",&local_5a9);
    pcVar5 = cmMakefile::GetProperty(pcVar1,&local_5a8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    local_588 = pcVar5;
    if ((pcVar5 != (char *)0x0) || (local_558 != (char *)0x0)) {
      std::operator<<((ostream *)local_318,"set_directory_properties(PROPERTIES LABELS ");
      pcVar5 = local_588;
      if (local_588 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,pcVar5,&local_5f1);
        cmOutputConverter::EscapeForCMake(&local_5d0,&local_5f0);
        std::operator<<((ostream *)local_318,(string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::allocator<char>::~allocator(&local_5f1);
      }
      if ((local_588 != (char *)0x0) && (local_558 != (char *)0x0)) {
        std::operator<<((ostream *)local_318,";");
      }
      pcVar5 = local_558;
      if (local_558 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,pcVar5,&local_639);
        cmOutputConverter::EscapeForCMake(&local_618,&local_638);
        std::operator<<((ostream *)local_318,(string *)&local_618);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_638);
        std::allocator<char>::~allocator(&local_639);
      }
      poVar4 = std::operator<<((ostream *)local_318,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)&__range1_1);
    std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector(&local_470);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_318);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&config);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
  }

  const char* testIncludeFiles =
    this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    std::vector<std::string> includesList;
    cmSystemTools::ExpandListArgument(testIncludeFiles, includesList);
    for (std::string const& i : includesList) {
      fout << "include(\"" << i << "\")" << std::endl;
    }
  }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const& testers =
    this->Makefile->GetTestGenerators();
  for (cmTestGenerator* tester : testers) {
    tester->Compute(this);
    tester->Generate(fout, config, configurationTypes);
  }
  typedef std::vector<cmStateSnapshot> vec_t;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  std::string parentBinDir = this->GetCurrentBinaryDirectory();
  for (cmStateSnapshot const& i : children) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i.GetDirectory().GetCurrentBinary();
    outP = this->MaybeConvertToRelativePath(parentBinDir, outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")" << std::endl;
  }

  // Add directory labels property
  const char* directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  const char* labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(directoryLabels);
    }
    fout << ")" << std::endl;
  }
}